

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::Array2D<float>::Array2D(Array2D<float> *this,int nx,int ny,allocator_type allocator)

{
  ulong uVar1;
  ulong uVar2;
  Bounds2i local_10;
  
  uVar2 = 0;
  local_10.pMin.super_Tuple2<pbrt::Point2,_int>.x = nx >> 0x1f & nx;
  local_10.pMin.super_Tuple2<pbrt::Point2,_int>.y = ny >> 0x1f & ny;
  uVar1 = (ulong)(uint)nx;
  if (nx < 1) {
    uVar1 = uVar2;
  }
  if (0 < ny) {
    uVar2 = (ulong)(uint)ny;
  }
  local_10.pMax.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar1 | uVar2 << 0x20)
  ;
  Array2D(this,&local_10,allocator);
  return;
}

Assistant:

Array2D(int nx, int ny, allocator_type allocator = {})
        : Array2D({{0, 0}, {nx, ny}}, allocator) {}